

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::APIErrors::checkGLError
          (APIErrors *this,GLenum expected_error,GLchar *description,bool *out_result)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8.m_value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (local_1b8.m_value != expected_error) {
    local_1a8._0_8_ = ((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Test case fail. Description: ");
    std::operator<<((ostream *)this_00,description);
    std::operator<<((ostream *)this_00," Invalid error: ");
    local_1b8.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," expected: ");
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    *out_result = false;
  }
  return;
}

Assistant:

void APIErrors::checkGLError(GLenum expected_error, const GLchar* description, bool& out_result)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLenum error = gl.getError();

	if (expected_error != error)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case fail. Description: " << description
											<< " Invalid error: " << glu::getErrorStr(error)
											<< " expected: " << glu::getErrorStr(expected_error)
											<< tcu::TestLog::EndMessage;

		out_result = false;
	}
}